

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmsrcf.cpp
# Opt level: O0

ulong __thiscall CVmSrcfEntry::find_src_addr(CVmSrcfEntry *this,ulong *linenum,int exact)

{
  bool bVar1;
  long local_68;
  long local_60;
  int match;
  long cur;
  long lo;
  long hi;
  int exact_local;
  ulong *linenum_local;
  CVmSrcfEntry *this_local;
  
  if (this->lines_cnt_ != 0) {
    lo = 0;
    hi = this->lines_cnt_ - 1;
    while (lo <= hi) {
      local_68 = lo + (hi - lo) / 2;
      if (exact == 0) {
        if (local_68 == 0) {
          bVar1 = *linenum <= this->lines_->linenum;
        }
        else if (local_68 == this->lines_cnt_ - 1) {
          bVar1 = this->lines_[local_68].linenum <= *linenum;
        }
        else {
          bVar1 = false;
          if (*linenum <= this->lines_[local_68].linenum) {
            bVar1 = this->lines_[local_68 + -1].linenum < *linenum;
          }
        }
      }
      else {
        bVar1 = this->lines_[local_68].linenum == *linenum;
      }
      if (bVar1) {
        *linenum = this->lines_[local_68].linenum;
        return this->lines_[local_68].code_addr;
      }
      if (this->lines_[local_68].linenum < *linenum) {
        local_60 = local_68;
        if (local_68 == lo) {
          local_60 = local_68 + 1;
        }
        lo = local_60;
      }
      else {
        if (local_68 == hi) {
          local_68 = hi + -1;
        }
        hi = local_68;
      }
    }
  }
  return 0;
}

Assistant:

ulong CVmSrcfEntry::find_src_addr(ulong *linenum, int exact)
{
    long hi, lo, cur;

    /* if there are no line records, return failure */
    if (lines_cnt_ == 0)
        return 0;

    /* perform a binary search of the line record array */
    lo = 0;
    hi =  (long)lines_cnt_ - 1;
    while (lo <= hi)
    {
        int match;
        
        /* split the difference */
        cur = lo + (hi - lo)/2;

        /* 
         *   Check for a match.  If they require an exact match, we must
         *   find the line number exactly.  Otherwise, check to see if
         *   this is the next executable line after the given line. 
         */
        if (exact)
        {
            /* exact match required */
            match = (lines_[cur].linenum == *linenum);
        }
        else
        {
            /* 
             *   exact match not required - match if this is the next
             *   executable line after the requested line, or this is the
             *   last executable line and the requested line is higher 
             */
            if (cur == 0)
            {
                /* 
                 *   this is the first executable line - if the requested
                 *   line is before this one, this is our match 
                 */
                match = (*linenum <= lines_[cur].linenum);
            }
            else if (cur == (long)lines_cnt_ - 1)
            {
                /* 
                 *   this is the last executable line - if the requested
                 *   line is after this one, this is our match 
                 */
                match = (*linenum >= lines_[cur].linenum);
            }
            else
            {
                /* 
                 *   we're somewhere in the middle of the file - if the
                 *   requested line is before this one, but after the
                 *   previous executable line, this is our match 
                 */
                match = (*linenum <= lines_[cur].linenum
                         && *linenum > lines_[cur - 1].linenum);
            }
        }

        /* if we have a match, return it; otherwise, keep searching */
        if (match)
        {
            /* 
             *   if this is a non-exact match, update the caller's line
             *   number with the actual line number we found 
             */
            *linenum = lines_[cur].linenum;
            
            /* return our code address */
            return lines_[cur].code_addr;
        }
        else if (*linenum > lines_[cur].linenum)
        {
            /* we need to go higher */
            lo = (cur == lo ? cur + 1 : cur);
        }
        else
        {
            /* we need to go lower */
            hi = (cur == hi ? hi - 1 : cur);
        }
    }

    /* failure */
    return 0;
}